

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

pointer __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
create_array<jsoncons::json_array<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>const&>
          (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,allocator_type *alloc
          ,json_array<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
           *args)

{
  pointer pjVar1;
  
  pjVar1 = (pointer)operator_new(0x20);
  std::
  vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  ::vector(&pjVar1->elements_,&args->elements_);
  return pjVar1;
}

Assistant:

typename array_storage::pointer create_array(const allocator_type& alloc, Args&& ... args)
        {
            using stor_allocator_type = typename array_storage::allocator_type;
            stor_allocator_type stor_alloc(alloc);
            auto ptr = std::allocator_traits<stor_allocator_type>::allocate(stor_alloc, 1);
            JSONCONS_TRY
            {
                std::allocator_traits<stor_allocator_type>::construct(stor_alloc, ext_traits::to_plain_pointer(ptr), 
                    std::forward<Args>(args)...);
            }